

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::WriteTailCallStack(CWriter *this)

{
  Newline *u;
  Newline *u_00;
  Newline *u_01;
  string local_30;
  
  WriteData(this,"void *instance_ptr_storage;",0x1b);
  Write(this);
  (anonymous_namespace)::CWriter::Write<char_const(&)[45],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [45])"void **instance_ptr = &instance_ptr_storage;",u);
  std::__cxx11::to_string(&local_30,0x400);
  WriteData(this,"char tail_call_stack[",0x15);
  WriteData(this,local_30._M_dataplus._M_p,local_30._M_string_length);
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x1e58d1,u_00);
  std::__cxx11::string::_M_dispose();
  WriteData(this,"wasm_rt_tailcallee_t next_storage;",0x22);
  Write(this);
  (anonymous_namespace)::CWriter::Write<char_const(&)[44],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [44])"wasm_rt_tailcallee_t *next = &next_storage;",u_01);
  return;
}

Assistant:

void CWriter::WriteTailCallStack() {
  Write("void *instance_ptr_storage;", Newline());
  Write("void **instance_ptr = &instance_ptr_storage;", Newline());
  Write("char tail_call_stack[", std::to_string(kTailCallStackSize), "];",
        Newline());
  Write("wasm_rt_tailcallee_t next_storage;", Newline());
  Write("wasm_rt_tailcallee_t *next = &next_storage;", Newline());
}